

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Validator * __thiscall CLI::Validator::description(Validator *this,string *validator_desc)

{
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,validator_desc);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,(anon_class_32_1_5ff8519c *)local_30);
  ::std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

Validator &description(std::string validator_desc) {
        desc_function_ = [validator_desc]() { return validator_desc; };
        return *this;
    }